

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

Layer * ncnn::create_layer(int index)

{
  int iVar1;
  int in_EDI;
  Layer *layer;
  layer_creator_func layer_creator;
  code *local_18;
  Layer *local_8;
  
  if ((in_EDI < 0) || (0x5d < in_EDI)) {
    local_8 = (Layer *)0x0;
  }
  else {
    iVar1 = cpu_support_x86_avx512();
    if (iVar1 == 0) {
      iVar1 = cpu_support_x86_fma();
      if (iVar1 == 0) {
        iVar1 = cpu_support_x86_avx();
        if (iVar1 == 0) {
          local_18 = *(code **)(layer_registry + (long)in_EDI * 0x10 + 8);
        }
        else {
          local_18 = *(code **)(layer_registry_avx + (long)in_EDI * 0x10 + 8);
        }
      }
      else {
        local_18 = *(code **)(layer_registry_fma + (long)in_EDI * 0x10 + 8);
      }
    }
    else {
      local_18 = *(code **)(layer_registry_avx512 + (long)in_EDI * 0x10 + 8);
    }
    if (local_18 == (code *)0x0) {
      local_8 = (Layer *)0x0;
    }
    else {
      local_8 = (Layer *)(*local_18)(0);
      local_8->typeindex = in_EDI;
    }
  }
  return local_8;
}

Assistant:

Layer* create_layer(int index)
{
    if (index < 0 || index >= layer_registry_entry_count)
        return 0;

    // clang-format off
    // *INDENT-OFF*
    layer_creator_func layer_creator = 0;
#if NCNN_RUNTIME_CPU && NCNN_AVX512
    if (ncnn::cpu_support_x86_avx512())
    {
        layer_creator = layer_registry_avx512[index].creator;
    }
    else
#endif// NCNN_RUNTIME_CPU && NCNN_AVX512
#if NCNN_RUNTIME_CPU && NCNN_FMA
    if (ncnn::cpu_support_x86_fma())
    {
        layer_creator = layer_registry_fma[index].creator;
    }
    else
#endif// NCNN_RUNTIME_CPU && NCNN_FMA
#if NCNN_RUNTIME_CPU && NCNN_AVX
    if (ncnn::cpu_support_x86_avx())
    {
        layer_creator = layer_registry_avx[index].creator;
    }
    else
#endif // NCNN_RUNTIME_CPU && NCNN_AVX
#if NCNN_RUNTIME_CPU && NCNN_MSA
    if (ncnn::cpu_support_mips_msa())
    {
        layer_creator = layer_registry_msa[index].creator;
    }
    else
#endif // NCNN_RUNTIME_CPU && NCNN_MSA
#if NCNN_RUNTIME_CPU && NCNN_RVV
    if (ncnn::cpu_support_riscv_v())
    {
        layer_creator = layer_registry_rvv[index].creator;
    }
    else
#endif // NCNN_RUNTIME_CPU && NCNN_RVV
    {
        layer_creator = layer_registry[index].creator;
    }
    // *INDENT-ON*
    // clang-format on
    if (!layer_creator)
        return 0;

    Layer* layer = layer_creator(0);
    layer->typeindex = index;
    return layer;
}